

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

void text_undo(spng_ctx *ctx)

{
  spng_text2 *psVar1;
  uint uVar2;
  spng_text2 *text;
  spng_ctx *ctx_local;
  
  psVar1 = ctx->text_list;
  uVar2 = ctx->n_text - 1;
  spng__free(ctx,psVar1[uVar2].keyword);
  if (psVar1[uVar2].compression_flag != '\0') {
    spng__free(ctx,psVar1[uVar2].text);
  }
  decrease_cache_usage(ctx,psVar1[uVar2].cache_usage);
  decrease_cache_usage(ctx,0x90);
  psVar1[uVar2].keyword = (char *)0x0;
  psVar1[uVar2].text = (char *)0x0;
  ctx->n_text = ctx->n_text - 1;
  return;
}

Assistant:

static void text_undo(spng_ctx *ctx)
{
    struct spng_text2 *text = &ctx->text_list[ctx->n_text - 1];

    spng__free(ctx, text->keyword);
    if(text->compression_flag) spng__free(ctx, text->text);

    decrease_cache_usage(ctx, text->cache_usage);
    decrease_cache_usage(ctx, sizeof(struct spng_text2));

    text->keyword = NULL;
    text->text = NULL;

    ctx->n_text--;
}